

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O3

bool __thiscall
ON_Brep::IsValidEdgeTolerancesAndFlags(ON_Brep *this,int edge_index,ON_TextLog *text_log)

{
  ON_BrepEdge *pOVar1;
  
  if (edge_index < 0 ||
      (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count <=
      edge_index) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n"
                        ,(ulong)(uint)edge_index);
      return false;
    }
  }
  else {
    pOVar1 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    if (pOVar1[(uint)edge_index].m_edge_index == edge_index) {
      if (0.0 < pOVar1[(uint)edge_index].m_tolerance || pOVar1[(uint)edge_index].m_tolerance == 0.0)
      {
        return true;
      }
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"edge.m_tolerance=%g (should be >= 0.0)\n",
                        pOVar1[(uint)edge_index].m_tolerance);
    }
    else {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"edge.m_edge_index = %d (should be %d).\n",
                        (ulong)(uint)pOVar1[(uint)edge_index].m_edge_index,(ulong)(uint)edge_index);
    }
    ON_TextLog::PopIndent(text_log);
  }
  return false;
}

Assistant:

bool
ON_Brep::IsValidEdgeTolerancesAndFlags( int edge_index, ON_TextLog* text_log ) const
{
  if ( edge_index < 0 || edge_index >= m_E.Count() )
  {
    if ( text_log )
      text_log->Print("brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n",
                      edge_index, m_E.Count());
    return false;
  }
  const ON_BrepEdge& edge = m_E[edge_index];
  if ( edge.m_edge_index != edge_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_edge_index = %d (should be %d).\n",
                       edge.m_edge_index, edge_index );
      text_log->PopIndent();
    }
    return false;
  }

  if ( edge.m_tolerance < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_tolerance=%g (should be >= 0.0)\n",edge.m_tolerance);
      text_log->PopIndent();
    }
    return false;
  }

  return true;
}